

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O2

int xmlTextReaderAttributeCount(xmlTextReaderPtr reader)

{
  int iVar1;
  xmlNodePtr pxVar2;
  xmlNs *pxVar3;
  _xmlAttr **pp_Var4;
  
  if (reader == (xmlTextReaderPtr)0x0) {
    iVar1 = -1;
  }
  else {
    iVar1 = 0;
    if (reader->node != (xmlNodePtr)0x0) {
      pxVar2 = reader->node;
      if (reader->curnode != (xmlNodePtr)0x0) {
        pxVar2 = reader->curnode;
      }
      if (((pxVar2->type == XML_ELEMENT_NODE) && (reader->state != XML_TEXTREADER_END)) &&
         (reader->state != XML_TEXTREADER_BACKTRACK)) {
        iVar1 = -1;
        for (pp_Var4 = &pxVar2->properties; *pp_Var4 != (_xmlAttr *)0x0; pp_Var4 = &(*pp_Var4)->next
            ) {
          iVar1 = iVar1 + 1;
        }
        pxVar3 = (xmlNs *)&pxVar2->nsDef;
        do {
          pxVar3 = pxVar3->next;
          iVar1 = iVar1 + 1;
        } while (pxVar3 != (xmlNs *)0x0);
      }
    }
  }
  return iVar1;
}

Assistant:

int
xmlTextReaderAttributeCount(xmlTextReaderPtr reader) {
    int ret;
    xmlAttrPtr attr;
    xmlNsPtr ns;
    xmlNodePtr node;

    if (reader == NULL)
	return(-1);
    if (reader->node == NULL)
	return(0);

    if (reader->curnode != NULL)
	node = reader->curnode;
    else
	node = reader->node;

    if (node->type != XML_ELEMENT_NODE)
	return(0);
    if ((reader->state == XML_TEXTREADER_END) ||
	(reader->state == XML_TEXTREADER_BACKTRACK))
	return(0);
    ret = 0;
    attr = node->properties;
    while (attr != NULL) {
	ret++;
	attr = attr->next;
    }
    ns = node->nsDef;
    while (ns != NULL) {
	ret++;
	ns = ns->next;
    }
    return(ret);
}